

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int rfftb1_(int *n,int *in,double *c__,double *ch,double *wa,double *fac)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  double *pdVar13;
  int iVar14;
  int iVar15;
  int *piVar16;
  int l1;
  int ido;
  double *local_78;
  double *local_70;
  int *local_68;
  double *local_60;
  ulong local_58;
  double *local_50;
  int idl1;
  int local_44;
  double *local_40;
  int *local_38;
  
  iVar1 = *in;
  uVar2 = (ulong)iVar1;
  uVar3 = ~uVar2;
  uVar10 = (uint)fac[1];
  uVar7 = 0;
  local_58 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    local_58 = uVar7;
  }
  iVar9 = 1;
  iVar14 = 0;
  for (; local_58 != uVar7; uVar7 = uVar7 + 1) {
    iVar12 = 1 - iVar14;
    if ((int)fac[uVar7 + 2] < 6) {
      iVar14 = iVar12;
    }
    if ((ulong)uVar10 - 1 == uVar7) {
      iVar14 = iVar12;
    }
  }
  iVar12 = *n;
  uVar7 = (ulong)iVar12;
  lVar8 = (uVar7 | 0xfffffffffffffffe) + uVar7;
  if (iVar14 == 0) {
    pdVar4 = c__ + uVar3 + 1;
    for (lVar11 = 2; lVar11 <= (int)lVar8; lVar11 = lVar11 + 2) {
      pdVar4[uVar2 * 2] = pdVar4[uVar2 * 2] * 0.5;
      pdVar4[uVar2 * 3] = pdVar4[uVar2 * 3] * -0.5;
      pdVar4 = pdVar4 + uVar2 * 2;
    }
  }
  else {
    *ch = *c__;
    ch[uVar7 - 1] = c__[uVar3 + (long)(iVar12 * iVar1) + 1];
    pdVar4 = c__ + uVar3 + 1;
    for (lVar11 = 2; lVar11 <= lVar8; lVar11 = lVar11 + 2) {
      ch[lVar11 + -1] = pdVar4[uVar2 * 2] * 0.5;
      pdVar13 = pdVar4 + uVar2 * 3;
      pdVar4 = pdVar4 + uVar2 * 2;
      ch[lVar11] = *pdVar13 * -0.5;
    }
  }
  local_60 = wa + -1;
  l1 = 1;
  uVar2 = 0;
  local_78 = ch;
  local_70 = c__;
  local_68 = in;
  local_50 = fac;
  local_38 = n;
  do {
    if (local_58 == uVar2) {
      return 0;
    }
    iVar15 = (int)local_50[uVar2 + 2];
    iVar12 = l1 * iVar15;
    iVar1 = *local_38 / iVar12;
    idl1 = l1 * iVar1;
    ido = iVar1;
    local_44 = iVar15;
    switch(iVar15) {
    case 2:
      if (iVar14 == 0) {
        piVar16 = &c__1;
        piVar5 = local_68;
        pdVar4 = local_70;
        pdVar13 = local_78;
      }
      else {
        piVar5 = &c__1;
        pdVar4 = local_78;
        pdVar13 = local_70;
        piVar16 = local_68;
      }
      r1f2kb_(&ido,&l1,pdVar4,piVar5,pdVar13,piVar16,local_60 + iVar9);
      break;
    case 3:
      if (iVar14 == 0) {
        piVar16 = &c__1;
        piVar5 = local_68;
        pdVar4 = local_70;
        pdVar13 = local_78;
      }
      else {
        piVar5 = &c__1;
        pdVar4 = local_78;
        pdVar13 = local_70;
        piVar16 = local_68;
      }
      r1f3kb_(&ido,&l1,pdVar4,piVar5,pdVar13,piVar16,local_60 + iVar9,local_60 + (iVar9 + iVar1));
      break;
    case 4:
      if (iVar14 == 0) {
        piVar16 = &c__1;
        piVar5 = local_68;
        pdVar4 = local_70;
        pdVar13 = local_78;
      }
      else {
        piVar5 = &c__1;
        pdVar4 = local_78;
        pdVar13 = local_70;
        piVar16 = local_68;
      }
      r1f4kb_(&ido,&l1,pdVar4,piVar5,pdVar13,piVar16,local_60 + iVar9,local_60 + (iVar9 + iVar1),
              local_60 + (iVar9 + iVar1 + iVar1));
      break;
    case 5:
      iVar6 = iVar9 + iVar1 + iVar1;
      local_40 = local_60 + iVar9;
      if (iVar14 == 0) {
        piVar16 = &c__1;
        piVar5 = local_68;
        pdVar4 = local_70;
        pdVar13 = local_78;
      }
      else {
        piVar5 = &c__1;
        pdVar4 = local_78;
        pdVar13 = local_70;
        piVar16 = local_68;
      }
      r1f5kb_(&ido,&l1,pdVar4,piVar5,pdVar13,piVar16,local_40,local_60 + (iVar9 + iVar1),
              local_60 + iVar6,local_60 + (iVar6 + iVar1));
      break;
    default:
      if (iVar14 == 0) {
        piVar16 = &c__1;
        pdVar4 = local_70;
        piVar5 = local_68;
        pdVar13 = local_78;
      }
      else {
        pdVar4 = local_78;
        piVar5 = &c__1;
        pdVar13 = local_70;
        piVar16 = local_68;
      }
      r1fgkb_(&ido,&local_44,&l1,&idl1,pdVar4,pdVar4,pdVar4,piVar5,pdVar13,pdVar13,piVar16,
              local_60 + iVar9);
      if (iVar1 == 1) {
        iVar14 = 1 - iVar14;
      }
      goto LAB_00128d88;
    }
    iVar14 = 1 - iVar14;
LAB_00128d88:
    iVar9 = iVar9 + iVar1 * (iVar15 + -1);
    uVar2 = uVar2 + 1;
    l1 = iVar12;
  } while( true );
}

Assistant:

int rfftb1_(int *n, int *in, fft_real_t *c__, fft_real_t *ch,
	fft_real_t *wa, fft_real_t *fac)
{
    /* System generated locals */
    int c_dim1, c_offset, i__1;

    /* Local variables */
     int j, k1, l1, l2, na, nf, ip, nl, iw, ix2, ix3, ix4, ido,
	    idl1;
     fft_real_t half;
     int modn;
     fft_real_t halfm;
    extern /* Subroutine */ int r1f2kb_(int *, int *, fft_real_t *, int
	    *, fft_real_t *, int *, fft_real_t *), r1f4kb_(int *, int *, fft_real_t
	    *, int *, fft_real_t *, int *, fft_real_t *, fft_real_t *, fft_real_t *), r1f3kb_(
	    int *, int *, fft_real_t *, int *, fft_real_t *, int *, fft_real_t *
	    , fft_real_t *), r1f5kb_(int *, int *, fft_real_t *, int *, fft_real_t *
	    , int *, fft_real_t *, fft_real_t *, fft_real_t *, fft_real_t *), r1fgkb_(int *,
	    int *, int *, int *, fft_real_t *, fft_real_t *, fft_real_t *, int *
	    , fft_real_t *, fft_real_t *, int *, fft_real_t *);


    /* Parameter adjustments */
    --wa;
    c_dim1 = *in;
    c_offset = 1 + c_dim1;
    c__ -= c_offset;
    --ch;
    --fac;

    /* Function Body */
    nf = fac[2];
    na = 0;
    i__1 = nf;
    for (k1 = 1; k1 <= i__1; ++k1) {
	ip = fac[k1 + 2];
	na = 1 - na;
	if (ip <= 5) {
	    goto L10;
	}
	if (k1 == nf) {
	    goto L10;
	}
	na = 1 - na;
L10:
	;
    }
    half = .5;
    halfm = -.5;
    modn = *n % 2;
    nl = *n - 2;
    if (modn != 0) {
	nl = *n - 1;
    }
    if (na == 0) {
	goto L120;
    }
    ch[1] = c__[c_dim1 + 1];
    ch[*n] = c__[*n * c_dim1 + 1];
    i__1 = nl;
    for (j = 2; j <= i__1; j += 2) {
	ch[j] = half * c__[j * c_dim1 + 1];
	ch[j + 1] = halfm * c__[(j + 1) * c_dim1 + 1];
/* L118: */
    }
    goto L124;
L120:
    i__1 = nl;
    for (j = 2; j <= i__1; j += 2) {
	c__[j * c_dim1 + 1] = half * c__[j * c_dim1 + 1];
	c__[(j + 1) * c_dim1 + 1] = halfm * c__[(j + 1) * c_dim1 + 1];
/* L122: */
    }
L124:
    l1 = 1;
    iw = 1;
    i__1 = nf;
    for (k1 = 1; k1 <= i__1; ++k1) {
	ip = fac[k1 + 2];
	l2 = ip * l1;
	ido = *n / l2;
	idl1 = ido * l1;
	if (ip != 4) {
	    goto L103;
	}
	ix2 = iw + ido;
	ix3 = ix2 + ido;
	if (na != 0) {
	    goto L101;
	}
	r1f4kb_(&ido, &l1, &c__[c_offset], in, &ch[1], &c__1, &wa[iw], &wa[
		ix2], &wa[ix3]);
	goto L102;
L101:
	r1f4kb_(&ido, &l1, &ch[1], &c__1, &c__[c_offset], in, &wa[iw], &wa[
		ix2], &wa[ix3]);
L102:
	na = 1 - na;
	goto L115;
L103:
	if (ip != 2) {
	    goto L106;
	}
	if (na != 0) {
	    goto L104;
	}
	r1f2kb_(&ido, &l1, &c__[c_offset], in, &ch[1], &c__1, &wa[iw]);
	goto L105;
L104:
	r1f2kb_(&ido, &l1, &ch[1], &c__1, &c__[c_offset], in, &wa[iw]);
L105:
	na = 1 - na;
	goto L115;
L106:
	if (ip != 3) {
	    goto L109;
	}
	ix2 = iw + ido;
	if (na != 0) {
	    goto L107;
	}
	r1f3kb_(&ido, &l1, &c__[c_offset], in, &ch[1], &c__1, &wa[iw], &wa[
		ix2]);
	goto L108;
L107:
	r1f3kb_(&ido, &l1, &ch[1], &c__1, &c__[c_offset], in, &wa[iw], &wa[
		ix2]);
L108:
	na = 1 - na;
	goto L115;
L109:
	if (ip != 5) {
	    goto L112;
	}
	ix2 = iw + ido;
	ix3 = ix2 + ido;
	ix4 = ix3 + ido;
	if (na != 0) {
	    goto L110;
	}
	r1f5kb_(&ido, &l1, &c__[c_offset], in, &ch[1], &c__1, &wa[iw], &wa[
		ix2], &wa[ix3], &wa[ix4]);
	goto L111;
L110:
	r1f5kb_(&ido, &l1, &ch[1], &c__1, &c__[c_offset], in, &wa[iw], &wa[
		ix2], &wa[ix3], &wa[ix4]);
L111:
	na = 1 - na;
	goto L115;
L112:
	if (na != 0) {
	    goto L113;
	}
	r1fgkb_(&ido, &ip, &l1, &idl1, &c__[c_offset], &c__[c_offset], &c__[
		c_offset], in, &ch[1], &ch[1], &c__1, &wa[iw]);
	goto L114;
L113:
	r1fgkb_(&ido, &ip, &l1, &idl1, &ch[1], &ch[1], &ch[1], &c__1, &c__[
		c_offset], &c__[c_offset], in, &wa[iw]);
L114:
	if (ido == 1) {
	    na = 1 - na;
	}
L115:
	l1 = l2;
	iw += (ip - 1) * ido;
/* L116: */
    }
    return 0;
}